

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void set_type_qual(c2m_ctx_t c2m_ctx,node_t_conflict r,type_qual *tq,type_mode tmode)

{
  pos_t pVar1;
  char *local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  node_t_conflict local_30;
  node_t_conflict n;
  type_mode tmode_local;
  type_qual *tq_local;
  node_t_conflict r_local;
  c2m_ctx_t c2m_ctx_local;
  
  for (local_30 = DLIST_node_t_head(&(r->u).ops); local_30 != (node_t_conflict)0x0;
      local_30 = DLIST_node_t_next(local_30)) {
    switch(local_30->code) {
    case N_CONST:
      *(byte *)tq = *(byte *)tq & 0xfe | 1;
      break;
    case N_RESTRICT:
      *(byte *)tq = *(byte *)tq & 0xfd | 2;
      if ((tmode != TM_PTR) && (tmode != TM_UNDEF)) {
        pVar1 = get_node_pos(c2m_ctx,local_30);
        local_40 = pVar1.fname;
        local_38 = pVar1._8_8_;
        error(c2m_ctx,0x1d642c,local_40,local_38);
      }
      break;
    case N_VOLATILE:
      *(byte *)tq = *(byte *)tq & 0xfb | 4;
      break;
    case N_ATOMIC:
      *(byte *)tq = *(byte *)tq & 0xf7 | 8;
      if (tmode == TM_ARR) {
        pVar1 = get_node_pos(c2m_ctx,local_30);
        local_50 = pVar1.fname;
        local_48 = pVar1._8_8_;
        error(c2m_ctx,0x1d6448,local_50,local_48);
      }
      else if (tmode == TM_FUNC) {
        pVar1 = get_node_pos(c2m_ctx,local_30);
        local_60 = pVar1.fname;
        local_58 = pVar1._8_8_;
        error(c2m_ctx,0x1d6461,local_60,local_58);
      }
    }
  }
  return;
}

Assistant:

static void set_type_qual (c2m_ctx_t c2m_ctx, node_t r, struct type_qual *tq,
                           enum type_mode tmode) {
  for (node_t n = NL_HEAD (r->u.ops); n != NULL; n = NL_NEXT (n)) switch (n->code) {
      /* Type qualifiers: */
    case N_CONST: tq->const_p = TRUE; break;
    case N_RESTRICT:
      tq->restrict_p = TRUE;
      if (tmode != TM_PTR && tmode != TM_UNDEF)
        error (c2m_ctx, POS (n), "restrict requires a pointer");
      break;
    case N_VOLATILE: tq->volatile_p = TRUE; break;
    case N_ATOMIC:
      tq->atomic_p = TRUE;
      if (tmode == TM_ARR)
        error (c2m_ctx, POS (n), "_Atomic qualifying array");
      else if (tmode == TM_FUNC)
        error (c2m_ctx, POS (n), "_Atomic qualifying function");
      break;
    default: break; /* Ignore */
    }
}